

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O2

MediumHandle __thiscall
pbrt::MediumHandle::Create
          (MediumHandle *this,string *name,ParameterDictionary *parameters,
          Transform *renderFromMedium,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  GeneralMedium<pbrt::UniformGridMediumProvider> *pGVar2;
  UniformGridMediumProvider *provider;
  CloudMediumProvider *provider_00;
  NanoVDBMediumProvider *provider_01;
  ulong uVar3;
  char *pcVar4;
  
  bVar1 = std::operator==(name,"homogeneous");
  if (bVar1) {
    pGVar2 = (GeneralMedium<pbrt::UniformGridMediumProvider> *)
             HomogeneousMedium::Create(parameters,loc,alloc);
    uVar3 = 0x1000000000000;
  }
  else {
    bVar1 = std::operator==(name,"uniformgrid");
    if (bVar1) {
      provider = UniformGridMediumProvider::Create(parameters,loc,alloc);
      pGVar2 = GeneralMedium<pbrt::UniformGridMediumProvider>::Create
                         (provider,parameters,renderFromMedium,loc,alloc);
      uVar3 = 0x2000000000000;
    }
    else {
      pcVar4 = "cloud";
      bVar1 = std::operator==(name,"cloud");
      if (bVar1) {
        provider_00 = CloudMediumProvider::Create(parameters,(FileLoc *)pcVar4,alloc);
        pGVar2 = (GeneralMedium<pbrt::UniformGridMediumProvider> *)
                 GeneralMedium<pbrt::CloudMediumProvider>::Create
                           (provider_00,parameters,renderFromMedium,loc,alloc);
        uVar3 = 0x3000000000000;
      }
      else {
        bVar1 = std::operator==(name,"nanovdb");
        if (!bVar1) {
          pcVar4 = "%s: medium unknown.";
          goto LAB_003dde5d;
        }
        provider_01 = NanoVDBMediumProvider::Create(parameters,loc,alloc);
        pGVar2 = (GeneralMedium<pbrt::UniformGridMediumProvider> *)
                 GeneralMedium<pbrt::NanoVDBMediumProvider>::Create
                           (provider_01,parameters,renderFromMedium,loc,alloc);
        uVar3 = 0x4000000000000;
      }
    }
  }
  (this->
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  ).bits = uVar3 | (ulong)pGVar2;
  if (((ulong)pGVar2 & 0xffffffffffff) != 0) {
    ParameterDictionary::ReportUnused(parameters);
    return (MediumHandle)
           (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            )this;
  }
  pcVar4 = "%s: unable to create medium.";
LAB_003dde5d:
  ErrorExit<std::__cxx11::string_const&>(loc,pcVar4,name);
}

Assistant:

MediumHandle MediumHandle::Create(const std::string &name,
                                  const ParameterDictionary &parameters,
                                  const Transform &renderFromMedium, const FileLoc *loc,
                                  Allocator alloc) {
    MediumHandle m = nullptr;
    if (name == "homogeneous")
        m = HomogeneousMedium::Create(parameters, loc, alloc);
    else if (name == "uniformgrid") {
        UniformGridMediumProvider *provider =
            UniformGridMediumProvider::Create(parameters, loc, alloc);
        m = GeneralMedium<UniformGridMediumProvider>::Create(
            provider, parameters, renderFromMedium, loc, alloc);
    } else if (name == "cloud") {
        CloudMediumProvider *provider =
            CloudMediumProvider::Create(parameters, loc, alloc);
        m = GeneralMedium<CloudMediumProvider>::Create(provider, parameters,
                                                       renderFromMedium, loc, alloc);
    } else if (name == "nanovdb") {
        NanoVDBMediumProvider *provider =
            NanoVDBMediumProvider::Create(parameters, loc, alloc);
        m = GeneralMedium<NanoVDBMediumProvider>::Create(provider, parameters,
                                                         renderFromMedium, loc, alloc);
    } else
        ErrorExit(loc, "%s: medium unknown.", name);

    if (!m)
        ErrorExit(loc, "%s: unable to create medium.", name);

    parameters.ReportUnused();
    return m;
}